

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

Dec_Graph_t * Abc_ManResubQuit0(Abc_Obj_t *pRoot,Abc_Obj_t *pObj)

{
  Dec_Graph_t *pDVar1;
  Dec_Edge_t DVar2;
  
  pDVar1 = Dec_GraphCreate(1);
  (pDVar1->pNodes->field_2).pFunc = pObj;
  DVar2 = (Dec_Edge_t)(*(uint *)&pObj->field_0x14 >> 7 & 1);
  pDVar1->eRoot = DVar2;
  if ((pRoot->field_0x14 & 0x80) != 0) {
    pDVar1->eRoot = (Dec_Edge_t)((uint)DVar2 ^ 1);
  }
  return pDVar1;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit0( Abc_Obj_t * pRoot, Abc_Obj_t * pObj )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot;
    pGraph = Dec_GraphCreate( 1 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj;
    eRoot = Dec_EdgeCreate( 0, pObj->fPhase );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}